

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonValue.h
# Opt level: O0

Data * __thiscall Json::JsonValue::data(Data *__return_storage_ptr__,JsonValue *this)

{
  JsonValue *this_local;
  
  Data::Data(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual Data data() const { return Data(); }